

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_wu_2009.h
# Opt level: O2

void __thiscall SAUF<TTA>::PerformLabeling(SAUF<TTA> *this)

{
  undefined8 uVar1;
  uint uVar2;
  int iVar3;
  Mat1b *pMVar4;
  Mat1i *pMVar5;
  uint *puVar6;
  uint uVar7;
  long lVar8;
  int r;
  long lVar9;
  long lVar10;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  long lVar14;
  long lVar15;
  ulong uVar16;
  long lVar17;
  long lVar18;
  int local_9c;
  Size local_98;
  Mat local_90 [96];
  
  pMVar4 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
  uVar7 = *(uint *)&pMVar4->field_0x8;
  uVar2 = *(uint *)&pMVar4->field_0xc;
  local_98.height = (int)**(undefined8 **)&pMVar4->field_0x40;
  local_98.width = (int)((ulong)**(undefined8 **)&pMVar4->field_0x40 >> 0x20);
  local_9c = 0;
  cv::Mat_<int>::Mat_((Mat_<int> *)local_90,&local_98,&local_9c);
  cv::Mat::operator=(&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->super_Mat,
                     local_90);
  cv::Mat::~Mat(local_90);
  uVar1 = *(undefined8 *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0x8;
  TTA::Alloc((((int)((ulong)uVar1 >> 0x20) + 1) / 2) * (((int)uVar1 + 1) / 2) + 1);
  *TTA::rtable_ = 0;
  uVar13 = 0;
  uVar12 = 0;
  if (0 < (int)uVar2) {
    uVar12 = (ulong)uVar2;
  }
  uVar16 = (ulong)uVar7;
  if ((int)uVar7 < 1) {
    uVar16 = uVar13;
  }
  TTA::length_ = 1;
  lVar14 = -1;
  do {
    if (uVar13 == uVar16) {
      uVar7 = TTA::Flatten();
      (this->super_Labeling2D<(Connectivity2D)8,_false>).n_labels_ = uVar7;
      pMVar5 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_;
      for (lVar14 = 0; puVar6 = TTA::rtable_, lVar14 < *(int *)&pMVar5->field_0x8;
          lVar14 = lVar14 + 1) {
        lVar10 = **(long **)&pMVar5->field_0x48 * lVar14 + *(long *)&pMVar5->field_0x10;
        iVar3 = *(int *)&pMVar5->field_0xc;
        for (lVar15 = 0; (long)iVar3 * 4 != lVar15; lVar15 = lVar15 + 4) {
          *(uint *)(lVar10 + lVar15) = puVar6[*(uint *)(lVar10 + lVar15)];
        }
      }
      TTA::Dealloc();
      return;
    }
    pMVar4 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
    pMVar5 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_;
    lVar10 = *(long *)&pMVar4->field_0x10;
    lVar15 = **(long **)&pMVar4->field_0x48;
    lVar18 = lVar15 * uVar13 + lVar10;
    lVar9 = *(long *)&pMVar5->field_0x10;
    lVar17 = **(long **)&pMVar5->field_0x48;
    lVar11 = lVar17 * uVar13 + lVar9;
    lVar9 = lVar17 * lVar14 + lVar9;
    lVar10 = lVar10 + lVar15 * lVar14;
    lVar17 = 0;
    lVar15 = -1;
    while (lVar15 - uVar12 != -1) {
      if (*(char *)(lVar18 + 1 + lVar15) != '\0') {
        if (uVar13 == 0) {
          lVar8 = lVar15;
          if (lVar15 != -1) {
LAB_001b4fab:
            if (*(char *)(lVar18 + lVar8) != '\0') {
              uVar7 = *(uint *)(lVar11 + lVar8 * 4);
              goto LAB_001b5022;
            }
          }
LAB_001b5001:
          uVar7 = TTA::NewLabel();
        }
        else if (*(char *)(lVar10 + 1 + lVar15) == '\0') {
          if ((lVar15 + 1 < (long)(int)uVar2 + -1) && (*(char *)(lVar10 + 2 + lVar15) != '\0')) {
            if (lVar15 == -1) {
LAB_001b506b:
              uVar7 = *(uint *)(lVar9 + 8 + lVar15 * 4);
            }
            else {
              if (*(char *)(lVar10 + lVar15) == '\0') {
                if (*(char *)(lVar18 + lVar15) == '\0') goto LAB_001b506b;
                uVar7 = *(uint *)(lVar11 + lVar15 * 4);
              }
              else {
                uVar7 = *(uint *)(lVar9 + lVar15 * 4);
              }
              uVar7 = TTA::Merge(uVar7,*(uint *)(lVar9 + 8 + lVar15 * 4));
            }
          }
          else {
            if (lVar15 == -1) goto LAB_001b5001;
            if (*(char *)(lVar10 + lVar15) == '\0') {
              lVar8 = lVar17 + -1;
              goto LAB_001b4fab;
            }
            uVar7 = *(uint *)(lVar9 + lVar15 * 4);
          }
        }
        else {
          uVar7 = *(uint *)(lVar9 + 4 + lVar15 * 4);
        }
LAB_001b5022:
        *(uint *)(lVar11 + 4 + lVar15 * 4) = uVar7;
      }
      lVar17 = lVar17 + 1;
      lVar15 = lVar15 + 1;
    }
    uVar13 = uVar13 + 1;
    lVar14 = lVar14 + 1;
  } while( true );
}

Assistant:

void PerformLabeling()
    {
        const int h = img_.rows;
        const int w = img_.cols;

        img_labels_ = cv::Mat1i(img_.size(), 0); // Allocation + initialization of the output image

        LabelsSolver::Alloc(UPPER_BOUND_8_CONNECTIVITY); // Memory allocation of the labels solver
        LabelsSolver::Setup(); // Labels solver initialization

        // Rosenfeld Mask
        // +-+-+-+
        // |p|q|r|
        // +-+-+-+
        // |s|x|
        // +-+-+

        // First scan
        for (int r = 0; r < h; ++r) {
            // Get row pointers
            unsigned char const * const img_row = img_.ptr<unsigned char>(r);
            unsigned char const * const img_row_prev = (unsigned char *)(((char *)img_row) - img_.step.p[0]);
            unsigned * const  img_labels_row = img_labels_.ptr<unsigned>(r);
            unsigned * const  img_labels_row_prev = (unsigned *)(((char *)img_labels_row) - img_labels_.step.p[0]);

            for (int c = 0; c < w; ++c) {
#define CONDITION_P c > 0 && r > 0 && img_row_prev[c - 1] > 0
#define CONDITION_Q r > 0 && img_row_prev[c] > 0
#define CONDITION_R c < w - 1 && r > 0 && img_row_prev[c + 1] > 0
#define CONDITION_S c > 0 && img_row[c - 1] > 0
#define CONDITION_X img_row[c] > 0

#define ACTION_1 // nothing to do 
#define ACTION_2 img_labels_row[c] = LabelsSolver::NewLabel(); // new label
#define ACTION_3 img_labels_row[c] = img_labels_row_prev[c - 1]; // x <- p
#define ACTION_4 img_labels_row[c] = img_labels_row_prev[c]; // x <- q
#define ACTION_5 img_labels_row[c] = img_labels_row_prev[c + 1]; // x <- r
#define ACTION_6 img_labels_row[c] = img_labels_row[c - 1]; // x <- s
#define ACTION_7 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev[c - 1], img_labels_row_prev[c + 1]); // x <- p + r
#define ACTION_8 img_labels_row[c] = LabelsSolver::Merge(img_labels_row[c - 1], img_labels_row_prev[c + 1]); // x <- s + r

#include "labeling_wu_2009_tree.inc.h"
            }
        }

        // Second scan
        n_labels_ = LabelsSolver::Flatten();

        for (int r = 0; r < img_labels_.rows; ++r) {
            unsigned * img_row_start = img_labels_.ptr<unsigned>(r);
            unsigned * const img_row_end = img_row_start + img_labels_.cols;
            for (; img_row_start != img_row_end; ++img_row_start) {
                *img_row_start = LabelsSolver::GetLabel(*img_row_start);
            }
        }

        LabelsSolver::Dealloc(); // Memory deallocation of the labels solver

#undef ACTION_1
#undef ACTION_2
#undef ACTION_3
#undef ACTION_4
#undef ACTION_5
#undef ACTION_6
#undef ACTION_7
#undef ACTION_8

#undef CONDITION_P
#undef CONDITION_Q
#undef CONDITION_R
#undef CONDITION_S
#undef CONDITION_X
    }